

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O1

CURLcode tool_setopt_enum(CURL *curl,GlobalConfig *config,char *name,CURLoption tag,
                         NameValue *nvlist,long lval)

{
  long lVar1;
  CURLcode CVar2;
  char *pcVar3;
  char *fmt;
  long *plVar4;
  bool bVar5;
  
  CVar2 = curl_easy_setopt(curl,tag,lval);
  if ((CVar2 != CURLE_OK || lval == 0) || config->libcurl == (char *)0x0) {
    return CVar2;
  }
  pcVar3 = nvlist->name;
  bVar5 = pcVar3 == (char *)0x0;
  if (!bVar5) {
    if (nvlist->value != lval) {
      plVar4 = &nvlist[1].value;
      do {
        pcVar3 = ((NameValue *)(plVar4 + -1))->name;
        bVar5 = pcVar3 == (char *)0x0;
        if (bVar5) goto LAB_0011ab0e;
        lVar1 = *plVar4;
        plVar4 = plVar4 + 2;
      } while (lVar1 != lval);
    }
    if (!bVar5) {
      fmt = "curl_easy_setopt(hnd, %s, (long)%s);";
      goto LAB_0011ab35;
    }
  }
LAB_0011ab0e:
  fmt = "curl_easy_setopt(hnd, %s, %ldL);";
  pcVar3 = (char *)lval;
LAB_0011ab35:
  CVar2 = easysrc_addf(&easysrc_code,fmt,name,pcVar3);
  if (CVar2 == CURLE_OK) {
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

CURLcode tool_setopt_enum(CURL *curl, struct GlobalConfig *config,
                          const char *name, CURLoption tag,
                          const struct NameValue *nvlist, long lval)
{
  CURLcode ret = CURLE_OK;
  bool skip = FALSE;

  ret = curl_easy_setopt(curl, tag, lval);
  if(!lval)
    skip = TRUE;

  if(config->libcurl && !skip && !ret) {
    /* we only use this for real if --libcurl was used */
    const struct NameValue *nv = NULL;
    for(nv = nvlist; nv->name; nv++) {
      if(nv->value == lval)
        break; /* found it */
    }
    if(!nv->name) {
      /* If no definition was found, output an explicit value.
       * This could happen if new values are defined and used
       * but the NameValue list is not updated. */
      CODE2("curl_easy_setopt(hnd, %s, %ldL);", name, lval);
    }
    else {
      CODE2("curl_easy_setopt(hnd, %s, (long)%s);", name, nv->name);
    }
  }

#ifdef DEBUGBUILD
  if(ret)
    warnf(config, "option %s returned error (%d)\n", name, (int)ret);
#endif
  nomem:
  return ret;
}